

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

sample_type __thiscall
charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>::
decode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>
           *this,int32_t ra,int32_t rb)

{
  bool bVar1;
  int iVar2;
  uchar uVar3;
  int iVar4;
  int32_t iVar5;
  int32_t error_value;
  
  iVar4 = ra - rb;
  iVar2 = -iVar4;
  if (0 < iVar4) {
    iVar2 = iVar4;
  }
  if ((this->traits_).near_lossless < iVar2) {
    iVar5 = decode_run_interruption_error(this,(this->context_run_mode_)._M_elems);
    bVar1 = ra <= rb;
    ra = rb;
    error_value = -iVar5;
    if (bVar1) {
      error_value = iVar5;
    }
  }
  else {
    error_value = decode_run_interruption_error(this,(this->context_run_mode_)._M_elems + 1);
  }
  uVar3 = default_traits<unsigned_char,_unsigned_char>::compute_reconstructed_sample
                    (&this->traits_,ra,error_value);
  return uVar3;
}

Assistant:

sample_type decode_run_interruption_pixel(int32_t ra, int32_t rb)
    {
        if (std::abs(ra - rb) <= traits_.near_lossless)
        {
            const int32_t error_value{decode_run_interruption_error(context_run_mode_[1])};
            return static_cast<sample_type>(traits_.compute_reconstructed_sample(ra, error_value));
        }

        const int32_t error_value{decode_run_interruption_error(context_run_mode_[0])};
        return static_cast<sample_type>(traits_.compute_reconstructed_sample(rb, error_value * sign(rb - ra)));
    }